

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v5::internal::fp::compute_boundaries(fp *this,fp *lower,fp *upper)

{
  fp local_40;
  fp local_30;
  fp *local_20;
  fp *upper_local;
  fp *lower_local;
  fp *this_local;
  
  local_20 = upper;
  upper_local = lower;
  lower_local = this;
  if (this->f == 0x10000000000000) {
    fp(&local_30,this->f * 4 - 1,this->e + -2);
  }
  else {
    fp(&local_30,this->f * 2 - 1,this->e + -1);
  }
  upper_local->f = local_30.f;
  upper_local->e = local_30.e;
  fp(&local_40,this->f * 2 + 1,this->e + -1);
  local_20->f = local_40.f;
  local_20->e = local_40.e;
  normalize<1>(local_20);
  upper_local->f = upper_local->f << ((char)upper_local->e - (char)local_20->e & 0x3fU);
  upper_local->e = local_20->e;
  return;
}

Assistant:

void compute_boundaries(fp &lower, fp &upper) const {
    lower = f == implicit_bit ?
          fp((f << 2) - 1, e - 2) : fp((f << 1) - 1, e - 1);
    upper = fp((f << 1) + 1, e - 1);
    upper.normalize<1>();  // 1 is to account for the exponent shift above.
    lower.f <<= lower.e - upper.e;
    lower.e = upper.e;
  }